

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_intro.c
# Opt level: O1

char * mpt_log_intro(FILE *fd,int type)

{
  int iVar1;
  char *pcVar2;
  char *__s;
  
  if (((uint)type >> 9 & 1) == 0) {
LAB_001181bc:
    pcVar2 = (char *)0x0;
  }
  else {
    iVar1 = fileno((FILE *)fd);
    iVar1 = isatty(iVar1);
    if ((iVar1 == 0) || (pcVar2 = mpt_ansi_code((uint8_t)type), pcVar2 == (char *)0x0))
    goto LAB_001181bc;
    fputs(pcVar2,(FILE *)fd);
    pcVar2 = mpt_ansi_reset();
  }
  if (((uint)type >> 8 & 1) == 0) {
    return pcVar2;
  }
  __s = mpt_log_identifier(type);
  if (__s != (char *)0x0) {
    fputc(0x5b,(FILE *)fd);
    fputs(__s,(FILE *)fd);
    fputc(0x5d,(FILE *)fd);
    fputc(0x20,(FILE *)fd);
    if (pcVar2 != (char *)0x0) {
      if (((uint)type >> 10 & 1) != 0) goto LAB_0011821f;
      fputs(pcVar2,(FILE *)fd);
    }
    pcVar2 = (char *)0x0;
  }
LAB_0011821f:
  if (__s == (char *)0x0 && pcVar2 == (char *)0x0) {
    fputc(0x23,(FILE *)fd);
    fputc(0x20,(FILE *)fd);
  }
  return pcVar2;
}

Assistant:

extern const char *mpt_log_intro(FILE *fd, int type)
{
	const char *reset = 0;
	const char *desc = 0;
	
	/* change terminal color */
	if ((type & MPT_ENUM(LogSelect))
	    && isatty(fileno(fd))
	    && (reset = mpt_ansi_code(type))) {
		fputs(reset, fd);
		reset = mpt_ansi_reset();
	}
	/* no text intro */
	if (!(type & MPT_ENUM(LogPrefix))) {
		return reset;
	}
	/* print message type */
	if ((desc = mpt_log_identifier(type))) {
		fputc('[', fd);
		fputs(desc, fd);
		fputc(']', fd);
		fputc(' ', fd);
		if (reset && !(type & MPT_ENUM(LogANSIMore))) {
			fputs(reset, fd);
			reset = 0;
		}
	}
	/* no existing marking */
	if (!reset && !desc) {
		fputc('#', fd);
		fputc(' ', fd);
	}
	return reset;
}